

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

istream * maths::operator>>(istream *is,Matrix *m)

{
  int *in_RSI;
  istream *in_RDI;
  int j;
  int i;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < *in_RSI; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_RSI[1]; local_18 = local_18 + 1) {
      std::istream::operator>>
                (in_RDI,(double *)
                        (*(long *)(*(long *)(in_RSI + 2) + (long)local_14 * 8) + (long)local_18 * 8)
                );
    }
  }
  return in_RDI;
}

Assistant:

istream& operator>>(istream& is, Matrix& m)
{
    for (int i = 0; i < m.rows_; ++i) {
        for (int j = 0; j < m.cols_; ++j) {
            is >> m.p[i][j];
        }
    }
    return is;
}